

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall
cmComputeLinkDepends::AddVarLinkEntries(cmComputeLinkDepends *this,int depender_index,char *value)

{
  pointer pbVar1;
  cmTargetLinkLibraryType cVar2;
  bool bVar3;
  int iVar4;
  char *__s1;
  bool bVar5;
  cmTargetLinkLibraryType cVar6;
  pointer __lhs;
  bool bVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deplist;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> actual_libs;
  string var;
  
  deplist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deplist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deplist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&var,value,(allocator<char> *)&actual_libs);
  cVar6 = GENERAL_LibraryType;
  cmSystemTools::ExpandListArgument(&var,&deplist,false);
  std::__cxx11::string::~string((string *)&var);
  pbVar1 = deplist.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  actual_libs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  actual_libs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  actual_libs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar7 = false;
  __lhs = deplist.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__lhs == pbVar1) {
      AddLinkEntries<cmLinkItem>(this,depender_index,&actual_libs);
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&actual_libs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&deplist);
      return;
    }
    bVar3 = std::operator==(__lhs,"debug");
    bVar5 = true;
    if (bVar3) {
      cVar2 = DEBUG_LibraryType;
    }
    else {
      bVar3 = std::operator==(__lhs,"optimized");
      if (bVar3) {
        cVar2 = OPTIMIZED_LibraryType;
      }
      else {
        bVar3 = std::operator==(__lhs,"general");
        cVar2 = GENERAL_LibraryType;
        if ((!bVar3) && (cVar2 = cVar6, bVar5 = bVar7, __lhs->_M_string_length != 0)) {
          if (!bVar7) {
            std::__cxx11::string::string((string *)&var,(string *)__lhs);
            std::__cxx11::string::append((char *)&var);
            __s1 = cmMakefile::GetDefinition(this->Makefile,&var);
            if (__s1 != (char *)0x0) {
              iVar4 = strcmp(__s1,"debug");
              cVar2 = DEBUG_LibraryType;
              if ((iVar4 != 0) && (iVar4 = strcmp(__s1,"optimized"), cVar2 = cVar6, iVar4 == 0)) {
                cVar2 = OPTIMIZED_LibraryType;
              }
            }
            cVar6 = cVar2;
            std::__cxx11::string::~string((string *)&var);
          }
          if ((cVar6 == GENERAL_LibraryType) || (cVar6 == this->LinkType)) {
            ResolveLinkItem((cmLinkItem *)&var,this,depender_index,__lhs);
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      (&actual_libs,(cmLinkItem *)&var);
          }
          else {
            cVar2 = GENERAL_LibraryType;
            bVar5 = false;
            if (this->OldLinkDirMode != true) goto LAB_002e6a00;
            ResolveLinkItem((cmLinkItem *)&var,this,depender_index,__lhs);
            CheckWrongConfigItem(this,(cmLinkItem *)&var);
          }
          cmLinkItem::~cmLinkItem((cmLinkItem *)&var);
          cVar2 = GENERAL_LibraryType;
          bVar5 = false;
        }
      }
    }
LAB_002e6a00:
    bVar7 = bVar5;
    cVar6 = cVar2;
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

void cmComputeLinkDepends::AddVarLinkEntries(int depender_index,
                                             const char* value)
{
  // This is called to add the dependencies named by
  // <item>_LIB_DEPENDS.  The variable contains a semicolon-separated
  // list.  The list contains link-type;item pairs and just items.
  std::vector<std::string> deplist;
  cmSystemTools::ExpandListArgument(value, deplist);

  // Look for entries meant for this configuration.
  std::vector<cmLinkItem> actual_libs;
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;
  for (std::string const& d : deplist) {
    if (d == "debug") {
      llt = DEBUG_LibraryType;
      haveLLT = true;
    } else if (d == "optimized") {
      llt = OPTIMIZED_LibraryType;
      haveLLT = true;
    } else if (d == "general") {
      llt = GENERAL_LibraryType;
      haveLLT = true;
    } else if (!d.empty()) {
      // If no explicit link type was given prior to this entry then
      // check if the entry has its own link type variable.  This is
      // needed for compatibility with dependency files generated by
      // the export_library_dependencies command from CMake 2.4 and
      // lower.
      if (!haveLLT) {
        std::string var = d;
        var += "_LINK_TYPE";
        if (const char* val = this->Makefile->GetDefinition(var)) {
          if (strcmp(val, "debug") == 0) {
            llt = DEBUG_LibraryType;
          } else if (strcmp(val, "optimized") == 0) {
            llt = OPTIMIZED_LibraryType;
          }
        }
      }

      // If the library is meant for this link type then use it.
      if (llt == GENERAL_LibraryType || llt == this->LinkType) {
        actual_libs.emplace_back(this->ResolveLinkItem(depender_index, d));
      } else if (this->OldLinkDirMode) {
        cmLinkItem item = this->ResolveLinkItem(depender_index, d);
        this->CheckWrongConfigItem(item);
      }

      // Reset the link type until another explicit type is given.
      llt = GENERAL_LibraryType;
      haveLLT = false;
    }
  }

  // Add the entries from this list.
  this->AddLinkEntries(depender_index, actual_libs);
}